

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O3

void xray_re::initialize(void)

{
  long lVar1;
  uint uVar2;
  uint uVar5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar6;
  uint uVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  float fVar19;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar20 [16];
  
  lVar1 = 0;
  do {
    auVar12._8_4_ = (int)lVar1;
    auVar12._0_8_ = lVar1;
    auVar12._12_4_ = (int)((ulong)lVar1 >> 0x20);
    uVar2 = (uint)(0x1ffd - lVar1);
    uVar5 = (uint)(0x1ffc - auVar12._8_8_);
    uVar6 = (uint)(0x1fff - lVar1);
    uVar11 = (uint)(0x1ffe - auVar12._8_8_);
    auVar9._0_4_ = uVar6 >> 7;
    auVar9._4_4_ = uVar11 >> 7;
    auVar9._8_4_ = uVar2 >> 7;
    auVar9._12_4_ = uVar5 >> 7;
    auVar7._0_8_ = CONCAT44(uVar11,uVar6) & 0x7f0000007f;
    auVar7._8_4_ = uVar2 & 0x7f;
    auVar7._12_4_ = uVar5 & 0x7f;
    auVar13._0_4_ = -(uint)(0x7e < auVar9._0_4_ + (uVar6 & 0x7f));
    auVar13._4_4_ = -(uint)(0x7e < auVar9._4_4_ + (uVar11 & 0x7f));
    auVar13._8_4_ = -(uint)(0x7e < auVar9._8_4_ + auVar7._8_4_);
    auVar13._12_4_ = -(uint)(0x7e < auVar9._12_4_ + auVar7._12_4_);
    auVar15._0_4_ = 0x7f - auVar9._0_4_;
    auVar15._4_4_ = 0x7f - auVar9._4_4_;
    auVar15._8_4_ = 0x7f - auVar9._8_4_;
    auVar15._12_4_ = 0x7f - auVar9._12_4_;
    auVar8._0_4_ = (uVar6 & 0x7f ^ 0x7f) & auVar13._0_4_;
    auVar8._4_4_ = (uVar11 & 0x7f ^ 0x7f) & auVar13._4_4_;
    auVar8._8_4_ = (auVar7._8_4_ ^ 0x7f) & auVar13._8_4_;
    auVar8._12_4_ = (auVar7._12_4_ ^ 0x7f) & auVar13._12_4_;
    auVar16 = auVar15 & auVar13 | ~auVar13 & auVar9;
    auVar8 = auVar8 | ~auVar13 & auVar7;
    iVar14 = auVar16._0_4_;
    iVar17 = auVar16._4_4_;
    iVar18 = auVar16._12_4_;
    auVar3._4_4_ = iVar17;
    auVar3._0_4_ = iVar17;
    auVar3._8_4_ = iVar18;
    auVar3._12_4_ = iVar18;
    auVar9 = pmaddwd(auVar8,auVar8);
    fVar19 = (126.0 - (float)iVar14) - (float)auVar8._0_4_;
    fVar21 = (126.0 - (float)iVar17) - (float)auVar8._4_4_;
    fVar22 = (126.0 - (float)auVar16._8_4_) - (float)auVar8._8_4_;
    fVar23 = (126.0 - (float)iVar18) - (float)auVar8._12_4_;
    auVar4._0_4_ = (float)(auVar9._0_4_ + iVar14 * iVar14);
    auVar4._4_4_ = (float)(auVar9._4_4_ + iVar17 * iVar17);
    auVar4._8_4_ = (float)(auVar9._8_4_ +
                          (int)((auVar16._8_8_ & 0xffffffff) * (auVar16._8_8_ & 0xffffffff)));
    auVar4._12_4_ =
         (float)(auVar9._12_4_ + (int)((auVar3._8_8_ & 0xffffffff) * (auVar3._8_8_ & 0xffffffff)));
    auVar20._0_4_ = fVar19 * fVar19 + auVar4._0_4_;
    auVar20._4_4_ = fVar21 * fVar21 + auVar4._4_4_;
    auVar20._8_4_ = fVar22 * fVar22 + auVar4._8_4_;
    auVar20._12_4_ = fVar23 * fVar23 + auVar4._12_4_;
    auVar9 = sqrtps(auVar4,auVar20);
    auVar10._8_4_ = 0x3f800000;
    auVar10._0_8_ = 0x3f8000003f800000;
    auVar10._12_4_ = 0x3f800000;
    auVar16._4_4_ = auVar9._8_4_;
    auVar16._0_4_ = auVar9._12_4_;
    auVar16._8_4_ = auVar9._4_4_;
    auVar16._12_4_ = auVar9._0_4_;
    auVar9 = divps(auVar10,auVar16);
    *(undefined1 (*) [16])((long)&xr_lzhuf::instance::instance + (0x1fff - lVar1) * 4 + 0xf6ec) =
         auVar9;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x2000);
  initialized = 1;
  return;
}

Assistant:

void initialize()
{
//	for (int i = 0; i != xr_dim(uv_adjustment); ++i) {
	for (int i = xr_dim(uv_adjustment); --i >= 0;) {
		int u = i >> 7;
		int v = i & 0x7f;
		if (u + v >= 127) {
			u = 127 - u;
			v = 127 - v;
		}
		uv_adjustment[i] = 1.f/std::sqrt(u*u + v*v + (126.f-u-v)*(126.f-u-v));
	}
	initialized = true;
}